

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O3

int Fax3Encode2DRow(TIFF *tif,uchar *bp,uchar *rp,uint32_t bits)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte *pbVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  uchar *puVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  tableentry *tab;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  
  uVar18 = 0;
  if ((0 < (int)bits) && (uVar18 = 0, -1 < (char)*bp)) {
    uVar18 = 0;
    pbVar4 = bp;
    uVar5 = bits;
    if (0x7f < bits) {
      if (((ulong)bp & 7) == 0) {
        uVar18 = 0;
        uVar6 = bits;
      }
      else {
        uVar18 = 0;
        puVar8 = bp + 1;
        do {
          if ((ulong)*pbVar4 != 0) {
            uVar10 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [*pbVar4];
            goto LAB_0029c678;
          }
          uVar18 = uVar18 + 8;
          pbVar4 = pbVar4 + 1;
          uVar17 = (ulong)puVar8 & 7;
          puVar8 = puVar8 + 1;
        } while (uVar17 != 0);
        uVar5 = bits - uVar18;
        uVar6 = uVar5;
        if ((int)(uVar5 + 8) < 0x48) goto LAB_0029c614;
      }
      do {
        if (*(long *)pbVar4 != 0) goto LAB_0029c61d;
        uVar18 = uVar18 + 0x40;
        uVar5 = uVar6 - 0x40;
        pbVar4 = pbVar4 + 8;
        bVar2 = 0x7f < (int)uVar6;
        uVar6 = uVar5;
      } while (bVar2);
    }
LAB_0029c614:
    uVar6 = uVar5;
    if (7 < (int)uVar5) {
LAB_0029c61d:
      iVar19 = -uVar18;
      do {
        if ((ulong)*pbVar4 != 0) {
          uVar18 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [*pbVar4] - iVar19;
          goto LAB_0029c67e;
        }
        uVar5 = uVar6 - 8;
        pbVar4 = pbVar4 + 1;
        iVar19 = iVar19 + -8;
        bVar2 = 0xf < (int)uVar6;
        uVar6 = uVar5;
      } while (bVar2);
      uVar18 = -iVar19;
    }
    if (0 < (int)uVar5) {
      uVar10 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                     [*pbVar4];
      if (uVar5 < "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [*pbVar4]) {
        uVar10 = uVar5;
      }
LAB_0029c678:
      uVar18 = uVar10 + uVar18;
    }
  }
LAB_0029c67e:
  uVar10 = 0;
  if (((int)bits < 1) || (uVar10 = 0, (char)*rp < '\0')) goto LAB_0029c76b;
  uVar10 = 0;
  pbVar4 = rp;
  uVar5 = bits;
  if (0x7f < bits) {
    if (((ulong)rp & 7) == 0) {
      uVar10 = 0;
      uVar6 = bits;
    }
    else {
      uVar10 = 0;
      puVar8 = rp + 1;
      do {
        if ((ulong)*pbVar4 != 0) {
          uVar14 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [*pbVar4];
          goto LAB_0029c769;
        }
        uVar10 = uVar10 + 8;
        pbVar4 = pbVar4 + 1;
        uVar17 = (ulong)puVar8 & 7;
        puVar8 = puVar8 + 1;
      } while (uVar17 != 0);
      uVar5 = bits - uVar10;
      uVar6 = uVar5;
      if ((int)(uVar5 + 8) < 0x48) goto LAB_0029c707;
    }
    do {
      if (*(long *)pbVar4 != 0) goto LAB_0029c710;
      uVar10 = uVar10 + 0x40;
      uVar5 = uVar6 - 0x40;
      pbVar4 = pbVar4 + 8;
      bVar2 = 0x7f < (int)uVar6;
      uVar6 = uVar5;
    } while (bVar2);
  }
LAB_0029c707:
  uVar6 = uVar5;
  if (7 < (int)uVar5) {
LAB_0029c710:
    iVar19 = -uVar10;
    do {
      if ((ulong)*pbVar4 != 0) {
        uVar10 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                       [*pbVar4] - iVar19;
        goto LAB_0029c76b;
      }
      uVar5 = uVar6 - 8;
      pbVar4 = pbVar4 + 1;
      iVar19 = iVar19 + -8;
      bVar2 = 0xf < (int)uVar6;
      uVar6 = uVar5;
    } while (bVar2);
    uVar10 = -iVar19;
  }
  if (0 < (int)uVar5) {
    uVar14 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                   [*pbVar4];
    if (uVar5 < "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                [*pbVar4]) {
      uVar14 = uVar5;
    }
LAB_0029c769:
    uVar10 = uVar10 + uVar14;
  }
LAB_0029c76b:
  uVar17 = 0;
LAB_0029c77a:
  uVar14 = bits - uVar10;
  uVar5 = bits;
  if (uVar10 <= bits && uVar14 != 0) {
    uVar7 = uVar10 & 7;
    bVar3 = (byte)uVar7;
    pbVar4 = rp + ((int)uVar10 >> 3);
    if ((rp[uVar10 >> 3] >> (bVar3 ^ 7) & 1) == 0) {
      if ((int)uVar14 < 1) goto LAB_0029c842;
      if (uVar7 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 8 - uVar7;
        if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar7) {
          uVar13 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(uint)*pbVar4 << bVar3 & 0xfe];
        }
        if (uVar14 <= uVar13) {
          uVar13 = uVar14;
        }
        if (uVar7 + uVar13 < 8) goto LAB_0029c9bc;
        uVar14 = uVar14 - uVar13;
        pbVar4 = pbVar4 + 1;
      }
      if (0x7f < (int)uVar14) {
        uVar7 = uVar14;
        if (((ulong)pbVar4 & 7) != 0) {
          iVar12 = -uVar13;
          iVar19 = 0;
          pbVar16 = pbVar4;
          do {
            pbVar16 = pbVar16 + 1;
            uVar9 = (ulong)*pbVar4;
            if (uVar9 != 0) {
              puVar8 = 
              "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              ;
              goto LAB_0029c9b3;
            }
            pbVar4 = pbVar4 + 1;
            iVar12 = iVar12 + -8;
            iVar19 = iVar19 + 8;
          } while (((ulong)pbVar16 & 7) != 0);
          uVar14 = uVar14 - iVar19;
          uVar13 = -iVar12;
          uVar7 = uVar14;
          if ((int)(uVar14 + 8) < 0x48) goto LAB_0029c94f;
        }
        do {
          uVar14 = uVar7;
          if (*(long *)pbVar4 != 0) goto LAB_0029c956;
          uVar13 = uVar13 + 0x40;
          uVar14 = uVar7 - 0x40;
          pbVar4 = pbVar4 + 8;
          bVar2 = 0x7f < (int)uVar7;
          uVar7 = uVar14;
        } while (bVar2);
      }
LAB_0029c94f:
      if (7 < (int)uVar14) {
LAB_0029c956:
        iVar12 = -uVar13;
        uVar7 = uVar14;
        do {
          uVar9 = (ulong)*pbVar4;
          if (uVar9 != 0) {
            puVar8 = 
            "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            ;
            goto LAB_0029c9a6;
          }
          uVar14 = uVar7 - 8;
          pbVar4 = pbVar4 + 1;
          iVar12 = iVar12 + -8;
          bVar2 = 0xf < (int)uVar7;
          uVar7 = uVar14;
        } while (bVar2);
        uVar13 = -iVar12;
      }
      if ((int)uVar14 < 1) goto LAB_0029c9bc;
      bVar3 = *pbVar4;
      puVar8 = 
      "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
      ;
      goto LAB_0029c980;
    }
    if (0 < (int)uVar14) {
      if (uVar7 == 0) {
        uVar13 = 0;
      }
      else {
        uVar13 = 8 - uVar7;
        if ((uint)""[(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar7) {
          uVar13 = (uint)""[(uint)*pbVar4 << bVar3 & 0xfe];
        }
        if (uVar14 <= uVar13) {
          uVar13 = uVar14;
        }
        if (uVar7 + uVar13 < 8) goto LAB_0029c9bc;
        uVar14 = uVar14 - uVar13;
        pbVar4 = pbVar4 + 1;
      }
      if (0x7f < (int)uVar14) {
        uVar7 = uVar14;
        if (((ulong)pbVar4 & 7) != 0) {
          iVar12 = -uVar13;
          iVar19 = 0;
          pbVar16 = pbVar4;
LAB_0029c85f:
          pbVar16 = pbVar16 + 1;
          uVar9 = (ulong)*pbVar4;
          if (uVar9 == 0xff) goto code_r0x0029c870;
          puVar8 = "";
LAB_0029c9b3:
          bVar3 = puVar8[uVar9];
          goto LAB_0029c9b8;
        }
        goto LAB_0029c896;
      }
      goto LAB_0029c8ad;
    }
LAB_0029c842:
    uVar13 = 0;
    goto LAB_0029c9bc;
  }
  goto LAB_0029c9be;
code_r0x0029c870:
  pbVar4 = pbVar4 + 1;
  iVar12 = iVar12 + -8;
  iVar19 = iVar19 + 8;
  if (((ulong)pbVar16 & 7) == 0) goto code_r0x0029c888;
  goto LAB_0029c85f;
code_r0x0029c888:
  uVar14 = uVar14 - iVar19;
  uVar13 = -iVar12;
  uVar7 = uVar14;
  if (0x47 < (int)(uVar14 + 8)) {
LAB_0029c896:
    do {
      uVar14 = uVar7;
      if (*(long *)pbVar4 != -1) goto LAB_0029c8b4;
      uVar13 = uVar13 + 0x40;
      uVar14 = uVar7 - 0x40;
      pbVar4 = pbVar4 + 8;
      bVar2 = 0x7f < (int)uVar7;
      uVar7 = uVar14;
    } while (bVar2);
  }
LAB_0029c8ad:
  if (7 < (int)uVar14) {
LAB_0029c8b4:
    iVar12 = -uVar13;
    uVar7 = uVar14;
LAB_0029c8b6:
    uVar9 = (ulong)*pbVar4;
    if (uVar9 == 0xff) goto code_r0x0029c8c6;
    puVar8 = "";
LAB_0029c9a6:
    bVar3 = puVar8[uVar9];
LAB_0029c9b8:
    uVar13 = (uint)bVar3 - iVar12;
    goto LAB_0029c9bc;
  }
LAB_0029c8d8:
  if (0 < (int)uVar14) {
    bVar3 = *pbVar4;
    puVar8 = "";
LAB_0029c980:
    uVar7 = (uint)puVar8[bVar3];
    if (uVar14 < puVar8[bVar3]) {
      uVar7 = uVar14;
    }
    uVar13 = uVar13 + uVar7;
  }
LAB_0029c9bc:
  uVar5 = uVar13 + uVar10;
LAB_0029c9be:
  if (uVar5 < uVar18) {
    iVar19 = Fax3PutBits(tif,1,4);
    uVar18 = uVar5;
LAB_0029ca14:
    uVar14 = uVar18;
    if (iVar19 == 0) {
      return 0;
    }
  }
  else {
    uVar14 = uVar10 - uVar18;
    if ((uVar18 <= uVar10) && (uVar14 < 4)) {
LAB_0029c9f0:
      iVar19 = Fax3PutBits(tif,(uint)vcodes[uVar14 + 3].code,(uint)vcodes[uVar14 + 3].length);
      goto LAB_0029ca14;
    }
    if ((uVar10 < uVar18) && (uVar18 - uVar10 < 4)) {
      uVar14 = -(uVar18 - uVar10);
      goto LAB_0029c9f0;
    }
    uVar10 = bits - uVar18;
    uVar14 = bits;
    if (uVar18 <= bits && uVar10 != 0) {
      uVar7 = uVar18 & 7;
      bVar3 = (byte)uVar7;
      pbVar4 = bp + ((int)uVar18 >> 3);
      if ((bp[uVar18 >> 3] >> (bVar3 ^ 7) & 1) == 0) {
        if ((int)uVar10 < 1) goto LAB_0029cdba;
        if (uVar7 == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = 8 - uVar7;
          if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar7) {
            uVar14 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [(uint)*pbVar4 << bVar3 & 0xfe];
          }
          if (uVar10 <= uVar14) {
            uVar14 = uVar10;
          }
          if (uVar7 + uVar14 < 8) goto LAB_0029d3d1;
          uVar10 = uVar10 - uVar14;
          pbVar4 = pbVar4 + 1;
        }
        if (0x7f < (int)uVar10) {
          uVar7 = uVar10;
          if (((ulong)pbVar4 & 7) != 0) {
            iVar12 = -uVar14;
            iVar19 = 0;
            pbVar16 = pbVar4;
            do {
              pbVar16 = pbVar16 + 1;
              uVar9 = (ulong)*pbVar4;
              if (uVar9 != 0) {
                puVar8 = 
                "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                ;
                goto LAB_0029d3c9;
              }
              pbVar4 = pbVar4 + 1;
              iVar12 = iVar12 + -8;
              iVar19 = iVar19 + 8;
            } while (((ulong)pbVar16 & 7) != 0);
            uVar10 = uVar10 - iVar19;
            uVar14 = -iVar12;
            uVar7 = uVar10;
            if ((int)(uVar10 + 8) < 0x48) goto LAB_0029d365;
          }
          do {
            uVar10 = uVar7;
            if (*(long *)pbVar4 != 0) goto LAB_0029d36c;
            uVar14 = uVar14 + 0x40;
            uVar10 = uVar7 - 0x40;
            pbVar4 = pbVar4 + 8;
            bVar2 = 0x7f < (int)uVar7;
            uVar7 = uVar10;
          } while (bVar2);
        }
LAB_0029d365:
        if (7 < (int)uVar10) {
LAB_0029d36c:
          iVar12 = -uVar14;
          uVar14 = uVar10;
          do {
            uVar9 = (ulong)*pbVar4;
            if (uVar9 != 0) {
              puVar8 = 
              "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              ;
              goto LAB_0029d3bc;
            }
            uVar10 = uVar14 - 8;
            pbVar4 = pbVar4 + 1;
            iVar12 = iVar12 + -8;
            bVar2 = 0xf < (int)uVar14;
            uVar14 = uVar10;
          } while (bVar2);
          uVar14 = -iVar12;
        }
        if (0 < (int)uVar10) {
          bVar3 = *pbVar4;
          puVar8 = 
          "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          ;
          goto LAB_0029d396;
        }
      }
      else if ((int)uVar10 < 1) {
LAB_0029cdba:
        uVar14 = 0;
      }
      else {
        if (uVar7 == 0) {
          uVar14 = 0;
        }
        else {
          uVar14 = 8 - uVar7;
          if ((uint)""[(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar7) {
            uVar14 = (uint)""[(uint)*pbVar4 << bVar3 & 0xfe];
          }
          if (uVar10 <= uVar14) {
            uVar14 = uVar10;
          }
          if (uVar7 + uVar14 < 8) goto LAB_0029d3d1;
          uVar10 = uVar10 - uVar14;
          pbVar4 = pbVar4 + 1;
        }
        if (0x7f < (int)uVar10) {
          uVar7 = uVar10;
          if (((ulong)pbVar4 & 7) != 0) {
            iVar12 = -uVar14;
            iVar19 = 0;
            pbVar16 = pbVar4;
LAB_0029d277:
            pbVar16 = pbVar16 + 1;
            uVar9 = (ulong)*pbVar4;
            if (uVar9 == 0xff) goto code_r0x0029d287;
            puVar8 = "";
LAB_0029d3c9:
            bVar3 = puVar8[uVar9];
            goto LAB_0029d3cd;
          }
LAB_0029d2ad:
          do {
            uVar10 = uVar7;
            if (*(long *)pbVar4 != -1) goto LAB_0029d2cb;
            uVar14 = uVar14 + 0x40;
            uVar10 = uVar7 - 0x40;
            pbVar4 = pbVar4 + 8;
            bVar2 = 0x7f < (int)uVar7;
            uVar7 = uVar10;
          } while (bVar2);
        }
LAB_0029d2c4:
        if (7 < (int)uVar10) {
LAB_0029d2cb:
          iVar12 = -uVar14;
          uVar14 = uVar10;
LAB_0029d2cd:
          uVar9 = (ulong)*pbVar4;
          if (uVar9 == 0xff) goto code_r0x0029d2dd;
          puVar8 = "";
LAB_0029d3bc:
          bVar3 = puVar8[uVar9];
LAB_0029d3cd:
          uVar14 = (uint)bVar3 - iVar12;
          goto LAB_0029d3d1;
        }
LAB_0029d2ef:
        if (0 < (int)uVar10) {
          bVar3 = *pbVar4;
          puVar8 = "";
LAB_0029d396:
          uVar7 = (uint)puVar8[bVar3];
          if (uVar10 < puVar8[bVar3]) {
            uVar7 = uVar10;
          }
          uVar14 = uVar14 + uVar7;
        }
      }
LAB_0029d3d1:
      uVar14 = uVar14 + uVar18;
    }
    iVar19 = Fax3PutBits(tif,1,3);
    if (iVar19 == 0) {
      return 0;
    }
    iVar19 = (int)uVar17;
    if ((iVar19 + uVar18 == 0) || ((bp[uVar17 >> 3] >> (~(byte)uVar17 & 7) & 1) == 0)) {
      iVar19 = putspan(tif,uVar18 - iVar19,TIFFFaxWhiteCodes);
      if (iVar19 == 0) {
        return 0;
      }
      tab = TIFFFaxBlackCodes;
    }
    else {
      iVar19 = putspan(tif,uVar18 - iVar19,TIFFFaxBlackCodes);
      if (iVar19 == 0) {
        return 0;
      }
      tab = TIFFFaxWhiteCodes;
    }
    iVar19 = putspan(tif,uVar14 - uVar18,tab);
    if (iVar19 == 0) {
      return 0;
    }
  }
  uVar17 = (ulong)uVar14;
  uVar7 = bits - uVar14;
  if (bits < uVar14 || uVar7 == 0) {
    return 1;
  }
  uVar13 = uVar14 & 7;
  bVar3 = (byte)uVar13;
  iVar19 = (int)uVar14 >> 3;
  pbVar4 = bp + iVar19;
  uVar15 = 1 << (bVar3 ^ 7) & (uint)bp[uVar14 >> 3];
  uVar10 = uVar7;
  if (uVar15 == 0) {
    if (0 < (int)uVar7) {
      if (uVar13 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 8 - uVar13;
        if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar13) {
          uVar18 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(uint)*pbVar4 << bVar3 & 0xfe];
        }
        if (uVar7 <= uVar18) {
          uVar18 = uVar7;
        }
        if (uVar13 + uVar18 < 8) goto LAB_0029cc88;
        pbVar4 = pbVar4 + 1;
        uVar10 = uVar7 - uVar18;
      }
      if (0x7f < (int)uVar10) {
        uVar11 = uVar10;
        if (((ulong)pbVar4 & 7) != 0) {
          iVar20 = -uVar18;
          iVar12 = 0;
          pbVar16 = pbVar4;
          do {
            pbVar16 = pbVar16 + 1;
            uVar9 = (ulong)*pbVar4;
            if (uVar9 != 0) {
              puVar8 = 
              "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
              ;
              goto LAB_0029cdc8;
            }
            pbVar4 = pbVar4 + 1;
            iVar20 = iVar20 + -8;
            iVar12 = iVar12 + 8;
          } while (((ulong)pbVar16 & 7) != 0);
          uVar10 = uVar10 - iVar12;
          uVar18 = -iVar20;
          uVar11 = uVar10;
          if ((int)(uVar10 + 8) < 0x48) goto LAB_0029cd02;
        }
        do {
          uVar10 = uVar11;
          if (*(long *)pbVar4 != 0) goto LAB_0029cd0a;
          uVar18 = uVar18 + 0x40;
          uVar10 = uVar11 - 0x40;
          pbVar4 = pbVar4 + 8;
          bVar2 = 0x7f < (int)uVar11;
          uVar11 = uVar10;
        } while (bVar2);
      }
LAB_0029cd02:
      if (7 < (int)uVar10) {
LAB_0029cd0a:
        iVar20 = -uVar18;
        uVar18 = uVar10;
        do {
          uVar9 = (ulong)*pbVar4;
          if (uVar9 != 0) {
            puVar8 = 
            "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            ;
            goto LAB_0029cd6c;
          }
          uVar10 = uVar18 - 8;
          pbVar4 = pbVar4 + 1;
          iVar20 = iVar20 + -8;
          bVar2 = 0xf < (int)uVar18;
          uVar18 = uVar10;
        } while (bVar2);
        uVar18 = -iVar20;
      }
      if (0 < (int)uVar10) {
        bVar1 = *pbVar4;
        puVar8 = 
        "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
        ;
        goto LAB_0029cd3e;
      }
      goto LAB_0029cdd3;
    }
    uVar18 = 0;
LAB_0029cc88:
    uVar18 = uVar18 + uVar14;
LAB_0029ce28:
    if (0 < (int)uVar7) {
      pbVar4 = rp + iVar19;
      if (uVar13 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 8 - uVar13;
        if ((uint)""[(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar13) {
          uVar10 = (uint)""[(uint)*pbVar4 << bVar3 & 0xfe];
        }
        if (uVar7 <= uVar10) {
          uVar10 = uVar7;
        }
        if (uVar13 + uVar10 < 8) goto LAB_0029cf33;
        uVar7 = uVar7 - uVar10;
        pbVar4 = pbVar4 + 1;
      }
      if (0x7f < (int)uVar7) {
        uVar13 = uVar7;
        if (((ulong)pbVar4 & 7) != 0) {
          iVar12 = -uVar10;
          iVar19 = 0;
          pbVar16 = pbVar4;
          do {
            pbVar16 = pbVar16 + 1;
            uVar9 = (ulong)*pbVar4;
            if (uVar9 != 0xff) {
              puVar8 = "";
              goto LAB_0029d015;
            }
            pbVar4 = pbVar4 + 1;
            iVar12 = iVar12 + -8;
            iVar19 = iVar19 + 8;
          } while (((ulong)pbVar16 & 7) != 0);
          uVar7 = uVar7 - iVar19;
          uVar10 = -iVar12;
          uVar13 = uVar7;
          if ((int)(uVar7 + 8) < 0x48) goto LAB_0029cfa6;
        }
        do {
          uVar7 = uVar13;
          if (*(long *)pbVar4 != -1) goto LAB_0029cfaf;
          uVar10 = uVar10 + 0x40;
          uVar7 = uVar13 - 0x40;
          pbVar4 = pbVar4 + 8;
          bVar2 = 0x7f < (int)uVar13;
          uVar13 = uVar7;
        } while (bVar2);
      }
LAB_0029cfa6:
      if (7 < (int)uVar7) {
LAB_0029cfaf:
        iVar12 = -uVar10;
        uVar10 = uVar7;
        do {
          uVar9 = (ulong)*pbVar4;
          if (uVar9 != 0xff) {
            puVar8 = "";
            goto LAB_0029d008;
          }
          uVar7 = uVar10 - 8;
          pbVar4 = pbVar4 + 1;
          iVar12 = iVar12 + -8;
          bVar2 = 0xf < (int)uVar10;
          uVar10 = uVar7;
        } while (bVar2);
        uVar10 = -iVar12;
      }
      if (0 < (int)uVar7) {
        bVar3 = *pbVar4;
        puVar8 = "";
        goto LAB_0029cfe0;
      }
      goto LAB_0029d01e;
    }
    uVar10 = 0;
LAB_0029cf33:
    uVar10 = uVar10 + uVar14;
LAB_0029d081:
    uVar14 = bits - uVar10;
    if (uVar14 == 0 || (int)bits < (int)uVar10) goto LAB_0029d0dc;
    pbVar4 = rp + ((int)uVar10 >> 3);
    uVar7 = uVar10 & 7;
    if (uVar7 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 8 - uVar7;
      if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                [(uint)*pbVar4 << (sbyte)uVar7 & 0xfe] <= 8 - uVar7) {
        uVar13 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                       [(uint)*pbVar4 << (sbyte)uVar7 & 0xfe];
      }
      if (uVar14 <= uVar13) {
        uVar13 = uVar14;
      }
      if (uVar7 + uVar13 < 8) goto LAB_0029d25a;
      uVar14 = uVar14 - uVar13;
      pbVar4 = pbVar4 + 1;
    }
    if (0x7f < (int)uVar14) {
      uVar7 = uVar14;
      if (((ulong)pbVar4 & 7) != 0) {
        iVar19 = -uVar13;
        iVar12 = 0;
        pbVar16 = pbVar4;
        do {
          pbVar16 = pbVar16 + 1;
          uVar9 = (ulong)*pbVar4;
          if (uVar9 != 0) {
            puVar8 = 
            "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
            ;
            goto LAB_0029d251;
          }
          pbVar4 = pbVar4 + 1;
          iVar19 = iVar19 + -8;
          iVar12 = iVar12 + 8;
        } while (((ulong)pbVar16 & 7) != 0);
        uVar14 = uVar14 - iVar12;
        uVar13 = -iVar19;
        uVar7 = uVar14;
        if ((int)(uVar14 + 8) < 0x48) goto LAB_0029d1ed;
      }
      do {
        uVar14 = uVar7;
        if (*(long *)pbVar4 != 0) goto LAB_0029d1f4;
        uVar13 = uVar13 + 0x40;
        uVar14 = uVar7 - 0x40;
        pbVar4 = pbVar4 + 8;
        bVar2 = 0x7f < (int)uVar7;
        uVar7 = uVar14;
      } while (bVar2);
    }
LAB_0029d1ed:
    if (7 < (int)uVar14) {
LAB_0029d1f4:
      iVar19 = -uVar13;
      uVar7 = uVar14;
      do {
        uVar9 = (ulong)*pbVar4;
        if (uVar9 != 0) {
          puVar8 = 
          "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          ;
          goto LAB_0029d244;
        }
        uVar14 = uVar7 - 8;
        pbVar4 = pbVar4 + 1;
        iVar19 = iVar19 + -8;
        bVar2 = 0xf < (int)uVar7;
        uVar7 = uVar14;
      } while (bVar2);
      uVar13 = -iVar19;
    }
    if ((int)uVar14 < 1) goto LAB_0029d25a;
    bVar3 = *pbVar4;
    puVar8 = 
    "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
    ;
  }
  else {
    if ((int)uVar7 < 1) {
      uVar18 = 0;
LAB_0029cb32:
      uVar18 = uVar18 + uVar14;
    }
    else {
      if (uVar13 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 8 - uVar13;
        if ((uint)""[(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar13) {
          uVar18 = (uint)""[(uint)*pbVar4 << bVar3 & 0xfe];
        }
        if (uVar7 <= uVar18) {
          uVar18 = uVar7;
        }
        if (uVar13 + uVar18 < 8) goto LAB_0029cb32;
        pbVar4 = pbVar4 + 1;
        uVar10 = uVar7 - uVar18;
      }
      if (0x7f < (int)uVar10) {
        uVar11 = uVar10;
        if (((ulong)pbVar4 & 7) != 0) {
          iVar20 = -uVar18;
          iVar12 = 0;
          pbVar16 = pbVar4;
LAB_0029cbe3:
          pbVar16 = pbVar16 + 1;
          uVar9 = (ulong)*pbVar4;
          if (uVar9 == 0xff) goto code_r0x0029cbf4;
          puVar8 = "";
LAB_0029cdc8:
          bVar1 = puVar8[uVar9];
          goto LAB_0029cdcd;
        }
LAB_0029cc21:
        do {
          uVar10 = uVar11;
          if (*(long *)pbVar4 != -1) goto LAB_0029cc44;
          uVar18 = uVar18 + 0x40;
          uVar10 = uVar11 - 0x40;
          pbVar4 = pbVar4 + 8;
          bVar2 = 0x7f < (int)uVar11;
          uVar11 = uVar10;
        } while (bVar2);
      }
LAB_0029cc3c:
      if (7 < (int)uVar10) {
LAB_0029cc44:
        iVar20 = -uVar18;
        uVar18 = uVar10;
LAB_0029cc47:
        uVar9 = (ulong)*pbVar4;
        if (uVar9 == 0xff) goto code_r0x0029cc57;
        puVar8 = "";
LAB_0029cd6c:
        bVar1 = puVar8[uVar9];
LAB_0029cdcd:
        uVar18 = (uint)bVar1 - iVar20;
        goto LAB_0029cdd3;
      }
LAB_0029cc6e:
      if (0 < (int)uVar10) {
        bVar1 = *pbVar4;
        puVar8 = "";
LAB_0029cd3e:
        uVar11 = (uint)puVar8[bVar1];
        if (uVar10 < puVar8[bVar1]) {
          uVar11 = uVar10;
        }
        uVar18 = uVar11 + uVar18;
      }
LAB_0029cdd3:
      uVar18 = uVar18 + uVar14;
      if (uVar15 == 0) goto LAB_0029ce28;
    }
    if ((int)uVar7 < 1) {
      uVar10 = 0;
LAB_0029ce7f:
      uVar10 = uVar10 + uVar14;
    }
    else {
      pbVar4 = rp + iVar19;
      if (uVar13 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = 8 - uVar13;
        if ((uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                  [(uint)*pbVar4 << bVar3 & 0xfe] <= 8 - uVar13) {
          uVar10 = (uint)"\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(uint)*pbVar4 << bVar3 & 0xfe];
        }
        if (uVar7 <= uVar10) {
          uVar10 = uVar7;
        }
        if (uVar13 + uVar10 < 8) goto LAB_0029ce7f;
        uVar7 = uVar7 - uVar10;
        pbVar4 = pbVar4 + 1;
      }
      if (0x7f < (int)uVar7) {
        uVar13 = uVar7;
        if (((ulong)pbVar4 & 7) != 0) {
          iVar12 = -uVar10;
          iVar19 = 0;
          pbVar16 = pbVar4;
LAB_0029cea0:
          pbVar16 = pbVar16 + 1;
          uVar9 = (ulong)*pbVar4;
          if (uVar9 == 0) goto code_r0x0029cead;
          puVar8 = 
          "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
          ;
LAB_0029d015:
          bVar3 = puVar8[uVar9];
          goto LAB_0029d01a;
        }
LAB_0029ced5:
        do {
          uVar7 = uVar13;
          if (*(long *)pbVar4 != 0) goto LAB_0029cef7;
          uVar10 = uVar10 + 0x40;
          uVar7 = uVar13 - 0x40;
          pbVar4 = pbVar4 + 8;
          bVar2 = 0x7f < (int)uVar13;
          uVar13 = uVar7;
        } while (bVar2);
      }
LAB_0029ceee:
      if (7 < (int)uVar7) {
LAB_0029cef7:
        iVar12 = -uVar10;
        uVar10 = uVar7;
LAB_0029cef9:
        uVar9 = (ulong)*pbVar4;
        if (uVar9 == 0) goto code_r0x0029cf05;
        puVar8 = 
        "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
        ;
LAB_0029d008:
        bVar3 = puVar8[uVar9];
LAB_0029d01a:
        uVar10 = (uint)bVar3 - iVar12;
        goto LAB_0029d01e;
      }
LAB_0029cf19:
      if (0 < (int)uVar7) {
        bVar3 = *pbVar4;
        puVar8 = 
        "\b\a\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x04\x04\x04\x04\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
        ;
LAB_0029cfe0:
        uVar13 = (uint)puVar8[bVar3];
        if (uVar7 < puVar8[bVar3]) {
          uVar13 = uVar7;
        }
        uVar10 = uVar10 + uVar13;
      }
LAB_0029d01e:
      uVar10 = uVar10 + uVar14;
      if (uVar15 == 0) goto LAB_0029d081;
    }
    uVar14 = bits - uVar10;
    if (uVar14 == 0 || (int)bits < (int)uVar10) {
LAB_0029d0dc:
      uVar13 = 0;
      goto LAB_0029d25a;
    }
    pbVar4 = rp + ((int)uVar10 >> 3);
    uVar7 = uVar10 & 7;
    if (uVar7 == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 8 - uVar7;
      if ((uint)""[(uint)*pbVar4 << (sbyte)uVar7 & 0xfe] <= 8 - uVar7) {
        uVar13 = (uint)""[(uint)*pbVar4 << (sbyte)uVar7 & 0xfe];
      }
      if (uVar14 <= uVar13) {
        uVar13 = uVar14;
      }
      if (uVar7 + uVar13 < 8) goto LAB_0029d25a;
      uVar14 = uVar14 - uVar13;
      pbVar4 = pbVar4 + 1;
    }
    if (0x7f < (int)uVar14) {
      uVar7 = uVar14;
      if (((ulong)pbVar4 & 7) != 0) {
        iVar19 = -uVar13;
        iVar12 = 0;
        pbVar16 = pbVar4;
LAB_0029d0fb:
        pbVar16 = pbVar16 + 1;
        uVar9 = (ulong)*pbVar4;
        if (uVar9 == 0xff) goto code_r0x0029d10c;
        puVar8 = "";
LAB_0029d251:
        bVar3 = puVar8[uVar9];
        goto LAB_0029d256;
      }
LAB_0029d132:
      do {
        uVar14 = uVar7;
        if (*(long *)pbVar4 != -1) goto LAB_0029d150;
        uVar13 = uVar13 + 0x40;
        uVar14 = uVar7 - 0x40;
        pbVar4 = pbVar4 + 8;
        bVar2 = 0x7f < (int)uVar7;
        uVar7 = uVar14;
      } while (bVar2);
    }
LAB_0029d149:
    if (7 < (int)uVar14) {
LAB_0029d150:
      iVar19 = -uVar13;
      uVar7 = uVar14;
LAB_0029d152:
      uVar9 = (ulong)*pbVar4;
      if (uVar9 == 0xff) goto code_r0x0029d162;
      puVar8 = "";
LAB_0029d244:
      bVar3 = puVar8[uVar9];
LAB_0029d256:
      uVar13 = (uint)bVar3 - iVar19;
      goto LAB_0029d25a;
    }
LAB_0029d174:
    if ((int)uVar14 < 1) goto LAB_0029d25a;
    bVar3 = *pbVar4;
    puVar8 = "";
  }
  uVar7 = (uint)puVar8[bVar3];
  if (uVar14 < puVar8[bVar3]) {
    uVar7 = uVar14;
  }
  uVar13 = uVar13 + uVar7;
LAB_0029d25a:
  uVar10 = uVar10 + uVar13;
  goto LAB_0029c77a;
code_r0x0029c8c6:
  uVar14 = uVar7 - 8;
  pbVar4 = pbVar4 + 1;
  iVar12 = iVar12 + -8;
  bVar2 = (int)uVar7 < 0x10;
  uVar7 = uVar14;
  if (bVar2) goto code_r0x0029c8d6;
  goto LAB_0029c8b6;
code_r0x0029c8d6:
  uVar13 = -iVar12;
  goto LAB_0029c8d8;
code_r0x0029d287:
  pbVar4 = pbVar4 + 1;
  iVar12 = iVar12 + -8;
  iVar19 = iVar19 + 8;
  if (((ulong)pbVar16 & 7) == 0) goto code_r0x0029d29f;
  goto LAB_0029d277;
code_r0x0029d29f:
  uVar10 = uVar10 - iVar19;
  uVar14 = -iVar12;
  uVar7 = uVar10;
  if (0x47 < (int)(uVar10 + 8)) goto LAB_0029d2ad;
  goto LAB_0029d2c4;
code_r0x0029d2dd:
  uVar10 = uVar14 - 8;
  pbVar4 = pbVar4 + 1;
  iVar12 = iVar12 + -8;
  bVar2 = (int)uVar14 < 0x10;
  uVar14 = uVar10;
  if (bVar2) goto code_r0x0029d2ed;
  goto LAB_0029d2cd;
code_r0x0029d2ed:
  uVar14 = -iVar12;
  goto LAB_0029d2ef;
code_r0x0029cbf4:
  pbVar4 = pbVar4 + 1;
  iVar20 = iVar20 + -8;
  iVar12 = iVar12 + 8;
  if (((ulong)pbVar16 & 7) == 0) goto code_r0x0029cc0e;
  goto LAB_0029cbe3;
code_r0x0029cc0e:
  uVar10 = uVar10 - iVar12;
  uVar18 = -iVar20;
  uVar11 = uVar10;
  if (0x47 < (int)(uVar10 + 8)) goto LAB_0029cc21;
  goto LAB_0029cc3c;
code_r0x0029cc57:
  uVar10 = uVar18 - 8;
  pbVar4 = pbVar4 + 1;
  iVar20 = iVar20 + -8;
  bVar2 = (int)uVar18 < 0x10;
  uVar18 = uVar10;
  if (bVar2) goto code_r0x0029cc6b;
  goto LAB_0029cc47;
code_r0x0029cc6b:
  uVar18 = -iVar20;
  goto LAB_0029cc6e;
code_r0x0029cead:
  pbVar4 = pbVar4 + 1;
  iVar12 = iVar12 + -8;
  iVar19 = iVar19 + 8;
  if (((ulong)pbVar16 & 7) == 0) goto code_r0x0029cec4;
  goto LAB_0029cea0;
code_r0x0029cec4:
  uVar7 = uVar7 - iVar19;
  uVar10 = -iVar12;
  uVar13 = uVar7;
  if (0x47 < (int)(uVar7 + 8)) goto LAB_0029ced5;
  goto LAB_0029ceee;
code_r0x0029cf05:
  uVar7 = uVar10 - 8;
  pbVar4 = pbVar4 + 1;
  iVar12 = iVar12 + -8;
  bVar2 = (int)uVar10 < 0x10;
  uVar10 = uVar7;
  if (bVar2) goto code_r0x0029cf17;
  goto LAB_0029cef9;
code_r0x0029cf17:
  uVar10 = -iVar12;
  goto LAB_0029cf19;
code_r0x0029d10c:
  pbVar4 = pbVar4 + 1;
  iVar19 = iVar19 + -8;
  iVar12 = iVar12 + 8;
  if (((ulong)pbVar16 & 7) == 0) goto code_r0x0029d124;
  goto LAB_0029d0fb;
code_r0x0029d124:
  uVar14 = uVar14 - iVar12;
  uVar13 = -iVar19;
  uVar7 = uVar14;
  if (0x47 < (int)(uVar14 + 8)) goto LAB_0029d132;
  goto LAB_0029d149;
code_r0x0029d162:
  uVar14 = uVar7 - 8;
  pbVar4 = pbVar4 + 1;
  iVar19 = iVar19 + -8;
  bVar2 = (int)uVar7 < 0x10;
  uVar7 = uVar14;
  if (bVar2) goto code_r0x0029d172;
  goto LAB_0029d152;
code_r0x0029d172:
  uVar13 = -iVar19;
  goto LAB_0029d174;
}

Assistant:

static int Fax3Encode2DRow(TIFF *tif, unsigned char *bp, unsigned char *rp,
                           uint32_t bits)
{
#define PIXEL(buf, ix) ((((buf)[(ix) >> 3]) >> (7 - ((ix)&7))) & 1)
    uint32_t a0 = 0;
    uint32_t a1 = (PIXEL(bp, 0) != 0 ? 0 : finddiff(bp, 0, bits, 0));
    uint32_t b1 = (PIXEL(rp, 0) != 0 ? 0 : finddiff(rp, 0, bits, 0));
    uint32_t a2, b2;

    for (;;)
    {
        b2 = finddiff2(rp, b1, bits, PIXEL(rp, b1));
        if (b2 >= a1)
        {
            /* Naive computation triggers
             * -fsanitize=undefined,unsigned-integer-overflow */
            /* although it is correct unless the difference between both is < 31
             * bit */
            /* int32_t d = b1 - a1; */
            int32_t d = (b1 >= a1 && b1 - a1 <= 3U)  ? (int32_t)(b1 - a1)
                        : (b1 < a1 && a1 - b1 <= 3U) ? -(int32_t)(a1 - b1)
                                                     : 0x7FFFFFFF;
            if (!(-3 <= d && d <= 3))
            { /* horizontal mode */
                a2 = finddiff2(bp, a1, bits, PIXEL(bp, a1));
                if (!putcode(tif, &horizcode))
                    return 0;
                if (a0 + a1 == 0 || PIXEL(bp, a0) == 0)
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxWhiteCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxBlackCodes))
                        return 0;
                }
                else
                {
                    if (!putspan(tif, a1 - a0, TIFFFaxBlackCodes))
                        return 0;
                    if (!putspan(tif, a2 - a1, TIFFFaxWhiteCodes))
                        return 0;
                }
                a0 = a2;
            }
            else
            { /* vertical mode */
                if (!putcode(tif, &vcodes[d + 3]))
                    return 0;
                a0 = a1;
            }
        }
        else
        { /* pass mode */
            if (!putcode(tif, &passcode))
                return 0;
            a0 = b2;
        }
        if (a0 >= bits)
            break;
        a1 = finddiff(bp, a0, bits, PIXEL(bp, a0));
        b1 = finddiff(rp, a0, bits, !PIXEL(bp, a0));
        b1 = finddiff(rp, b1, bits, PIXEL(bp, a0));
    }
    return (1);
#undef PIXEL
}